

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O0

String * __thiscall
Diligent::GetTextureComponentMappingString_abi_cxx11_
          (String *__return_storage_ptr__,Diligent *this,TextureComponentMapping *Mapping)

{
  TEXTURE_COMPONENT_SWIZZLE TVar1;
  ulong uStack_38;
  TEXTURE_COMPONENT_SWIZZLE ComponentSwizzle;
  size_t Comp;
  TextureComponentMapping *Mapping_local;
  String *Str;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  std::__cxx11::string::reserve((ulong)__return_storage_ptr__);
  for (uStack_38 = 0; uStack_38 < 4; uStack_38 = uStack_38 + 1) {
    TVar1 = TextureComponentMapping::operator[]((TextureComponentMapping *)this,uStack_38);
    if (TVar1 == TEXTURE_COMPONENT_SWIZZLE_IDENTITY) {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_01rgba"[uStack_38 + 3]);
    }
    else {
      std::__cxx11::string::operator+=((string *)__return_storage_ptr__,"_01rgba"[TVar1]);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String GetTextureComponentMappingString(const TextureComponentMapping& Mapping)
{
    static_assert(TEXTURE_COMPONENT_SWIZZLE_IDENTITY == 0, "TEXTURE_COMPONENT_SWIZZLE_IDENTITY == 0 is assumed below");
    static_assert(TEXTURE_COMPONENT_SWIZZLE_ZERO == 1, "TEXTURE_COMPONENT_SWIZZLE_ZERO == 1 is assumed below");
    static_assert(TEXTURE_COMPONENT_SWIZZLE_ONE == 2, "TEXTURE_COMPONENT_SWIZZLE_ONE == 2 is assumed below");
    static_assert(TEXTURE_COMPONENT_SWIZZLE_R == 3, "TEXTURE_COMPONENT_SWIZZLE_R == 3 is assumed below");
    static_assert(TEXTURE_COMPONENT_SWIZZLE_G == 4, "TEXTURE_COMPONENT_SWIZZLE_G == 4 is assumed below");
    static_assert(TEXTURE_COMPONENT_SWIZZLE_B == 5, "TEXTURE_COMPONENT_SWIZZLE_B == 5 is assumed below");
    static_assert(TEXTURE_COMPONENT_SWIZZLE_A == 6, "TEXTURE_COMPONENT_SWIZZLE_A == 6 is assumed below");
    String Str;
    Str.reserve(4);
    for (size_t Comp = 0; Comp < 4; ++Comp)
    {
        TEXTURE_COMPONENT_SWIZZLE ComponentSwizzle = Mapping[Comp];
        if (ComponentSwizzle == TEXTURE_COMPONENT_SWIZZLE_IDENTITY)
            Str += "rgba"[Comp];
        else
            Str += "_01rgba"[ComponentSwizzle];
    }
    return Str;
}